

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testchar.c
# Opt level: O3

int testDocumentRangeByte1
              (xmlParserCtxtPtr ctxt,char *document,int len,char *data,int forbid1,int forbid2)

{
  long lVar1;
  ulong uVar2;
  byte bVar3;
  uint uVar4;
  char *__format;
  
  uVar2 = (ulong)(uint)forbid1;
  uVar4 = 0;
  do {
    lastError = 0;
    xmlCtxtReset(ctxt);
    bVar3 = (byte)uVar4;
    *data = bVar3;
    lVar1 = xmlReadMemory(document,len,"test",0,0);
    if (forbid1 == uVar4) {
      if ((lastError == 0) || (lVar1 != 0)) {
        __format = "Failed to detect invalid char for Byte 0x%02X: %c\n";
        goto LAB_00101fb6;
      }
    }
    else if ((bVar3 == 0x3c) || ((uVar4 & 0xff) == 0x26)) {
      if ((lastError == 0) || (lVar1 != 0)) {
        __format = "Failed to detect illegal char %c for Byte 0x%02X\n";
LAB_00101fb2:
        uVar2 = (ulong)uVar4;
LAB_00101fb6:
        fprintf(_stderr,__format,uVar2,uVar2);
        return 1;
      }
    }
    else {
      if ((uVar4 - 0x80 < 0xffffffa0) && ((0xd < bVar3 || ((0x2600U >> (uVar4 & 0x1f) & 1) == 0))))
      {
        if (lVar1 != 0 && lastError != 9) {
          fprintf(_stderr,"Failed to detect invalid char for Byte 0x%02X\n",(ulong)uVar4);
          return 1;
        }
        if (lVar1 == 0) goto LAB_00101f38;
      }
      else if (lVar1 == 0) {
        __format = "Failed to parse valid char for Byte 0x%02X : %c\n";
        goto LAB_00101fb2;
      }
      xmlFreeDoc(lVar1);
    }
LAB_00101f38:
    uVar4 = uVar4 + 1;
    if (uVar4 == 0x100) {
      return 0;
    }
  } while( true );
}

Assistant:

static int testDocumentRangeByte1(xmlParserCtxtPtr ctxt, char *document,
                  int len,  char *data, int forbid1, int forbid2) {
    int i;
    xmlDocPtr res;

    for (i = 0;i <= 0xFF;i++) {
	lastError = 0;
	xmlCtxtReset(ctxt);

        data[0] = (char) i;

	res = xmlReadMemory(document, len, "test", NULL, 0);

	if ((i == forbid1) || (i == forbid2)) {
	    if ((lastError == 0) || (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect invalid char for Byte 0x%02X: %c\n",
		        i, i);
		return(1);
	    }
	}

	else if ((i == '<') || (i == '&')) {
	    if ((lastError == 0) || (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect illegal char %c for Byte 0x%02X\n", i, i);
		return(1);
	    }
	}
	else if (((i < 0x20) || (i >= 0x80)) &&
	    (i != 0x9) && (i != 0xA) && (i != 0xD)) {
	    if ((lastError != XML_ERR_INVALID_CHAR) && (res != NULL)) {
	        fprintf(stderr,
		    "Failed to detect invalid char for Byte 0x%02X\n", i);
		return(1);
	    }
	}
	else if (res == NULL) {
	    fprintf(stderr,
		"Failed to parse valid char for Byte 0x%02X : %c\n", i, i);
		return(1);
	}
	if (res != NULL)
	    xmlFreeDoc(res);
    }
    return(0);
}